

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O3

void * worker_thread_test_evict_by_LRU(void *arg)

{
  char extraout_AL;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong extraout_RDX;
  uint __oflag;
  ulong uVar2;
  char *__file;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar3;
  undefined1 auStack_f0 [64];
  undefined8 uStack_b0;
  undefined8 uStack_40;
  undefined1 *puStack_38;
  undefined1 *puStack_30;
  undefined1 *puStack_20;
  
  __file = *(char **)((long)arg + 8);
  uVar2 = 0;
  puStack_20 = (undefined1 *)0x103d02;
  iVar1 = vmemcache_evict(__file,0,0);
  if (iVar1 == 0) {
    do {
      puStack_20 = (undefined1 *)0x103d13;
      iVar1 = vmemcache_evict(*(undefined8 *)((long)arg + 8),0,0);
    } while (iVar1 == 0);
    LOCK();
    keep_running = 0;
    UNLOCK();
    return (void *)0x0;
  }
  puStack_20 = (undefined1 *)0x103d2d;
  uVar3 = extraout_XMM1_Qa;
  worker_thread_test_evict_by_LRU_cold_1();
  if (extraout_AL != '\0') {
    uStack_b0 = uVar3;
  }
  __oflag = (uint)uVar2;
  if ((~__oflag & 0x410000) != 0 && (uVar2 >> 6 & 1) == 0) {
    puStack_20 = &stack0xfffffffffffffff8;
    iVar1 = open(__file,__oflag);
    return (void *)CONCAT44(extraout_var,iVar1);
  }
  puStack_30 = auStack_f0;
  puStack_38 = &stack0xfffffffffffffff0;
  uStack_40 = 0x3000000018;
  puStack_20 = &stack0xfffffffffffffff8;
  iVar1 = open(__file,__oflag,extraout_RDX & 0xffffffff);
  return (void *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

static void *
worker_thread_test_evict_by_LRU(void *arg)
{
	struct context *ctx = arg;

	/* at least one entry has to be evicted successfully */
	if (vmemcache_evict(ctx->cache, NULL, 0))
		UT_FATAL("vmemcache_evict: %s", vmemcache_errormsg());

	/* try to evict all other entries */
	while (vmemcache_evict(ctx->cache, NULL, 0) == 0)
		;

	__atomic_store_n(&keep_running, 0, __ATOMIC_SEQ_CST);

	return NULL;
}